

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwap.c
# Opt level: O2

void Kit_TruthChangePhase_64bit(word *pInOut,int nVars,int iVar)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  size_t __n;
  long lVar4;
  word Temp [512];
  
  uVar3 = (ulong)(uint)(1 << ((char)nVars - 6U & 0x1f));
  if (nVars < 7) {
    uVar3 = 1;
  }
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckySwap.c"
                  ,0x6a,"void Kit_TruthChangePhase_64bit(word *, int, int)");
  }
  if (iVar < 6) {
    uVar2 = 0;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      bVar1 = (byte)(1 << ((byte)iVar & 0x1f));
      pInOut[uVar2] =
           (~mask0[iVar] & pInOut[uVar2]) >> (bVar1 & 0x3f) |
           (mask0[iVar] & pInOut[uVar2]) << (bVar1 & 0x3f);
    }
  }
  else {
    bVar1 = (byte)iVar - 6;
    __n = (size_t)(8 << (bVar1 & 0x1f));
    for (lVar4 = 0; (int)lVar4 < (int)uVar3; lVar4 = lVar4 + (2 << (bVar1 & 0x1f))) {
      memcpy(Temp,pInOut + lVar4,__n);
      memcpy(pInOut + lVar4,pInOut + (1 << (bVar1 & 0x1f)) + lVar4,__n);
      memcpy(pInOut + (1 << (bVar1 & 0x1f)) + lVar4,Temp,__n);
    }
  }
  return;
}

Assistant:

void Kit_TruthChangePhase_64bit( word * pInOut, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum_64bit( nVars );
    int i, Step,SizeOfBlock;
    word Temp[512];
    
    assert( iVar < nVars );
    if(iVar<=5)
    {
        for ( i = 0; i < nWords; i++ )
            pInOut[i] = ((pInOut[i] & mask0[iVar]) << (1<<(iVar))) | ((pInOut[i] & ~mask0[iVar]) >> (1<<(iVar)));
    }
    else
    {
        Step = (1 << (iVar - 6));
        SizeOfBlock = sizeof(word)*Step;
        for ( i = 0; i < nWords; i += 2*Step )
        {   
            memcpy(Temp,pInOut,SizeOfBlock);
            memcpy(pInOut,pInOut+Step,SizeOfBlock);
            memcpy(pInOut+Step,Temp,SizeOfBlock);
            //          Temp = pInOut[i];
            //          pInOut[i] = pInOut[Step+i];
            //          pInOut[Step+i] = Temp;          
            pInOut += 2*Step;
        }
    }
    
}